

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O3

void mafilter(double *sig,int N,int window,double *oup)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  void *__ptr;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  void *pvVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  uVar12 = window - (window >> 0x1f);
  uVar3 = uVar12 & 0xfffffffe;
  uVar11 = uVar3;
  if (uVar3 != window) {
    uVar12 = (window - (window + -1 >> 0x1f)) - 1;
    uVar11 = uVar12 & 0xfffffffe;
  }
  uVar12 = (int)uVar12 >> 1;
  __ptr = malloc((long)(int)(N + uVar11) * 8);
  if (0 < (int)uVar12) {
    dVar13 = *sig;
    uVar6 = 0;
    do {
      *(double *)((long)__ptr + uVar6 * 8) = dVar13;
      uVar6 = uVar6 + 1;
    } while (uVar12 != uVar6);
  }
  iVar8 = uVar12 + N;
  if (0 < N) {
    iVar2 = uVar12 + 1;
    if ((int)(uVar12 + 1) < iVar8) {
      iVar2 = iVar8;
    }
    memcpy((void *)((long)__ptr + (long)(int)uVar12 * 8),sig,(ulong)(~uVar12 + iVar2) * 8 + 8);
  }
  if ((int)uVar12 < (int)uVar11) {
    dVar13 = sig[(long)N + -1];
    lVar4 = (long)iVar8;
    do {
      *(double *)((long)__ptr + lVar4 * 8) = dVar13;
      lVar4 = lVar4 + 1;
    } while (lVar4 < (int)(N + uVar11));
  }
  if (uVar3 == window) {
    if (0 < N) {
      uVar11 = uVar11 | 1;
      lVar5 = (long)(int)uVar12;
      uVar12 = uVar12 * 2;
      lVar7 = 0;
      pvVar9 = __ptr;
      lVar4 = lVar5;
      do {
        dVar13 = 0.0;
        if (lVar4 - lVar5 <= lVar4 + lVar5) {
          dVar13 = 0.0;
          lVar10 = 0;
          do {
            dVar1 = *(double *)((long)pvVar9 + lVar10 * 8);
            dVar14 = dVar1 * 0.5 + dVar13;
            dVar15 = dVar14;
            if ((ulong)uVar12 + lVar7 != lVar10) {
              dVar15 = dVar13 + dVar1;
            }
            dVar13 = dVar14;
            if (lVar10 != 0) {
              dVar13 = dVar15;
            }
            lVar10 = lVar10 + 1;
          } while ((ulong)uVar11 + lVar7 != lVar10);
        }
        oup[lVar4 - lVar5] = dVar13 / (double)window;
        lVar4 = lVar4 + 1;
        uVar11 = uVar11 + 1;
        pvVar9 = (void *)((long)pvVar9 + 8);
        lVar7 = lVar7 + -1;
        uVar12 = uVar12 + 1;
      } while (lVar4 < iVar8);
    }
  }
  else if (0 < N) {
    uVar11 = uVar11 | 1;
    lVar5 = (long)(int)uVar12;
    lVar7 = 0;
    pvVar9 = __ptr;
    lVar4 = lVar5;
    do {
      dVar13 = 0.0;
      if (lVar4 - lVar5 <= lVar4 + lVar5) {
        lVar10 = 0;
        do {
          dVar13 = dVar13 + *(double *)((long)pvVar9 + lVar10 * 8);
          lVar10 = lVar10 + 1;
        } while ((ulong)uVar11 + lVar7 != lVar10);
      }
      oup[lVar4 - lVar5] = dVar13 / (double)window;
      lVar4 = lVar4 + 1;
      uVar11 = uVar11 + 1;
      pvVar9 = (void *)((long)pvVar9 + 8);
      lVar7 = lVar7 + -1;
    } while (lVar4 < iVar8);
  }
  free(__ptr);
  return;
}

Assistant:

void mafilter(double *sig,int N, int window,double *oup) {
	int odd,q,N2,i,j;
	double sum;
	double *temp;
	/*
	 * mafilter is a moving average filter that smoothes the signal using
	 * a smoothing window. In this implementation, the signal is extended
	 * by the length of the window. Length floor(window/2) extension is carried
	 * out at the beginning of the signal by setting values of the signal
	 * to sig[0]. The rest of the extension is done at the tail of the signal
	 * by setting it equal to sig[N-1].
	 *
	 */
	
	odd = window - ((window/2) * 2);
	
	if (odd) {
		q = (window - 1 ) / 2; 
	} else {
		q = window / 2;
	}
	
	N2 = N + (2 * q);
	
	temp = (double*) malloc (sizeof(double) * N2);
	
	for (i = 0; i < q; ++i) {
		temp[i] = sig[0];
	}
	
	for (i = q; i < N + q; ++i) {
		temp[i] = sig[i - q];
	}
	
	for (i = N + q; i < N2; ++i) {
		temp[i] = sig[N-1];
	}
	
	if (odd) {
		for (i = q; i < N+q; ++i) {
			sum = 0.0;
			for (j = i - q; j < i + q + 1;j++) {
				sum += temp[j];
			}
			oup[i-q] = sum /window;
		}  
	} else {
		for (i = q; i < N+q; ++i) {
			sum = 0.0;
			for (j = i - q; j < i + q + 1;j++) {
				if ( j == i - q || j == i + q) {
					sum += 0.5 * temp[j];
				} else {
					sum += temp[j];
				}
			}
			oup[i-q] = sum /window;
		}  
	}
	
	
	free(temp);
}